

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_eof(uv_stream_t *stream,uv_buf_t *buf)

{
  uv_buf_t *buf_local;
  uv_stream_t *stream_local;
  
  stream->flags = stream->flags | 0x800;
  stream->flags = stream->flags & 0xffffefff;
  uv__io_stop(stream->loop,&stream->io_watcher,1);
  if (((stream->flags & 4) != 0) &&
     (stream->flags = stream->flags & 0xfffffffb, (stream->flags & 8) != 0)) {
    stream->loop->active_handles = stream->loop->active_handles - 1;
  }
  uv__stream_osx_interrupt_select(stream);
  (*stream->read_cb)(stream,-0xfff,buf);
  return;
}

Assistant:

static void uv__stream_eof(uv_stream_t* stream, const uv_buf_t* buf) {
  stream->flags |= UV_HANDLE_READ_EOF;
  stream->flags &= ~UV_HANDLE_READING;
  uv__io_stop(stream->loop, &stream->io_watcher, POLLIN);
  uv__handle_stop(stream);
  uv__stream_osx_interrupt_select(stream);
  stream->read_cb(stream, UV_EOF, buf);
}